

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_animatable_default<double>
                   (string *__return_storage_ptr__,Animatable<double> *v,uint32_t indent)

{
  bool bVar1;
  allocator local_1b1;
  double local_1b0;
  double a;
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  Animatable<double> *pAStack_18;
  uint32_t indent_local;
  Animatable<double> *v_local;
  
  local_1c = indent;
  pAStack_18 = v;
  v_local = (Animatable<double> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&a);
  bVar1 = Animatable<double>::is_blocked(pAStack_18);
  if (bVar1) {
    ::std::operator<<(aoStack_198,"None");
  }
  bVar1 = Animatable<double>::has_value(pAStack_18);
  if (bVar1) {
    bVar1 = Animatable<double>::get_scalar(pAStack_18,&local_1b0);
    if (!bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"[Animatable: InternalError]",&local_1b1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      goto LAB_004505cf;
    }
    ::std::ostream::operator<<(aoStack_198,local_1b0);
  }
  ::std::__cxx11::stringstream::str();
LAB_004505cf:
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&a);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_default(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  (void)indent;

  std::stringstream ss;

  if (v.is_blocked()) {
    ss << "None";
  }

  if (v.has_value()) {
    T a;
    if (!v.get_scalar(&a)) {
      return "[Animatable: InternalError]";
    }
    ss << a;
  }

  return ss.str();
}